

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_TELEPORT(effect_handler_context_t_conflict *context)

{
  loc_conflict *plVar1;
  int iVar2;
  int iVar3;
  loc_conflict lVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  player *p;
  _Bool _Var8;
  int iVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  wchar_t wVar12;
  uint uVar13;
  uint32_t uVar14;
  loc_conflict lVar15;
  monster *pmVar16;
  loc lVar17;
  square *psVar18;
  monster_conflict *mon;
  int iVar19;
  uint uVar20;
  loc_conflict p_00;
  loc grid;
  char *fmt;
  chunk_conflict *c;
  ulong uVar21;
  long lVar22;
  int iVar23;
  bool bVar24;
  uint local_64;
  
  lVar15 = loc(context->x,context->y);
  iVar19 = (context->value).base;
  iVar2 = (context->value).m_bonus;
  uVar5._0_2_ = z_info->dungeon_wid;
  uVar5._2_2_ = z_info->town_hgt;
  uVar20 = (uint)z_info->dungeon_hgt;
  if (z_info->dungeon_hgt < (ushort)(undefined2)uVar5) {
    uVar20 = uVar5;
  }
  iVar3 = context->subtype;
  bVar6 = (context->origin).what != SRC_MONSTER;
  bVar7 = iVar3 != 0;
  pmVar16 = monster_target_monster(context);
  context->ident = true;
  if (player->upkeep->arena_level != false) {
    return true;
  }
  _Var8 = loc_is_zero(lVar15);
  if (_Var8) {
    if (pmVar16 == (monster *)0x0) {
      if (bVar6 || bVar7) {
        lVar17 = cave_find_decoy(cave);
        _Var8 = loc_is_zero((loc_conflict)lVar17);
        if (!_Var8 && iVar3 != 0) {
          square_destroy_decoy(cave,lVar17);
          return true;
        }
        plVar1 = &player->grid;
        lVar15.y = 0;
        lVar15.x = plVar1->x;
        lVar17.x = plVar1->x;
        lVar17.y = plVar1->y;
        uVar21 = (ulong)(uint)(player->grid).y;
        _Var8 = square_isno_teleport(cave,lVar17);
        if ((!_Var8) || (iVar19 < 0xb && iVar19 != 0)) {
          _Var8 = player_of_has(player,L'\x1d');
          if (!_Var8) {
            _Var8 = flag_has_dbg((player->state).pflags,10,0x37,"player->state.pflags",
                                 "(PF_PHASEWALK)");
            if (_Var8 && iVar3 != 0) {
              fmt = "Teleport resistance!";
              goto LAB_0013e6f8;
            }
            goto LAB_0013e4b7;
          }
          equip_learn_flag(player,L'\x1d');
        }
        fmt = "Teleportation forbidden!";
        goto LAB_0013e6f8;
      }
      if ((context->origin).what != SRC_MONSTER) {
        __assert_fail("context->origin.what == SRC_MONSTER",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-general.c"
                      ,0xa7e,"_Bool effect_handler_TELEPORT(effect_handler_context_t *)");
      }
      pmVar16 = cave_monster(cave,(context->origin).which.grid.x);
    }
    lVar15.y = 0;
    lVar15.x = (pmVar16->grid).x;
    uVar21 = (ulong)(uint)(pmVar16->grid).y;
  }
  else {
    uVar21 = (ulong)lVar15 >> 0x20;
  }
LAB_0013e4b7:
  iVar23 = lVar15.x;
  if (iVar2 != 0) {
    iVar9 = (int)uVar21;
    iVar19 = cave->height - iVar9;
    if (iVar19 < iVar9) {
      iVar19 = iVar9;
    }
    iVar9 = cave->width - iVar23;
    if (iVar9 < iVar23) {
      iVar9 = iVar23;
    }
    if (iVar9 < iVar19) {
      iVar9 = iVar19;
    }
    iVar19 = (iVar9 * iVar2) / 100;
  }
  local_64 = (uVar20 & 0xffff) * 2;
  uVar10 = Rand_div(2);
  uVar11 = Rand_div(iVar19 / 4);
  uVar14 = -uVar11;
  if (uVar10 != 0) {
    uVar14 = uVar11;
  }
  lVar17 = (loc)((ulong)lVar15 & 0xffffffff | uVar21 << 0x20);
  uVar10 = 0;
  bVar24 = true;
  p_00.x = 0;
  p_00.y = 0;
  c = cave;
  for (lVar22 = 1; lVar22 < (long)c->height + -1; lVar22 = lVar22 + 1) {
    for (uVar21 = 1; (long)uVar21 < (long)c->width + -1; uVar21 = uVar21 + 1) {
      grid = (loc)(lVar22 << 0x20 | uVar21);
      wVar12 = distance((loc_conflict)grid,(loc_conflict)lVar17);
      uVar20 = wVar12 - (uVar14 + iVar19);
      uVar5 = -uVar20;
      if (0 < (int)uVar20) {
        uVar5 = uVar20;
      }
      if ((wVar12 != L'\0') &&
         (_Var8 = has_teleport_destination_prereqs((chunk *)cave,grid,bVar6 || bVar7), _Var8)) {
        _Var8 = square_isvault(cave,grid);
        if (_Var8) {
          if (!bVar24) goto LAB_0013e613;
        }
        else {
          if (bVar24) {
            uVar20._0_2_ = z_info->dungeon_wid;
            uVar20._2_2_ = z_info->town_hgt;
            uVar13 = (uint)z_info->dungeon_hgt;
            if (z_info->dungeon_hgt < (ushort)(undefined2)uVar20) {
              uVar13 = uVar20;
            }
            local_64 = (uVar13 & 0xffff) * 2;
          }
          bVar24 = false;
        }
        if ((int)uVar5 <= (int)local_64) {
          lVar15 = (loc_conflict)mem_zalloc(0x10);
          *(int *)lVar15 = (int)uVar21;
          *(int *)((long)lVar15 + 4) = (int)lVar22;
          if (uVar5 < local_64) {
            while (p_00 != (loc_conflict)0x0) {
              lVar4 = *(loc_conflict *)((long)p_00 + 8);
              mem_free((void *)p_00);
              p_00 = lVar4;
            }
            uVar10 = 1;
            p_00 = lVar15;
            local_64 = uVar5;
          }
          else {
            *(loc_conflict *)((long)lVar15 + 8) = p_00;
            uVar10 = uVar10 + 1;
            p_00 = lVar15;
          }
        }
      }
LAB_0013e613:
      c = cave;
    }
  }
  if (uVar10 != 0) {
    uVar14 = Rand_div(uVar10);
    while (bVar24 = uVar14 != 0, uVar14 = uVar14 - 1, bVar24) {
      lVar15 = *(loc_conflict *)((long)p_00 + 8);
      mem_free((void *)p_00);
      p_00 = lVar15;
    }
    bVar24 = !bVar6 && !bVar7;
    if (iVar3 == 0 && (bVar6 || bVar7)) {
      _Var8 = flag_has_dbg((player->state).pflags,10,0x37,"player->state.pflags","(PF_PHASEWALK)");
      p = player;
      iVar19 = 10;
      if (_Var8) {
        wVar12 = distance((loc_conflict)lVar17,*(loc_conflict *)p_00);
        player_add_speed_boost(p,wVar12 + L'\x14');
      }
    }
    else {
      iVar19 = (uint)bVar24 + (uint)bVar24 * 4 + 10;
    }
    sound(iVar19);
    monster_swap(lVar17,*(loc *)p_00);
    if (bVar6 || bVar7) {
      player_handle_post_move(player,true,(context->origin).what == SRC_MONSTER);
    }
    psVar18 = square(cave,*(loc *)p_00);
    flag_off(psVar18->info,3,0x12);
    pmVar16 = target_get_monster();
    _Var8 = target_able(pmVar16);
    if (!_Var8) {
      target_set_monster((monster *)0x0);
    }
    handle_stuff(player);
    while (p_00 != (loc_conflict)0x0) {
      lVar15 = *(loc_conflict *)((long)p_00 + 8);
      mem_free((void *)p_00);
      p_00 = lVar15;
    }
    return true;
  }
  if (!bVar6 && !bVar7) {
    mon = (monster_conflict *)cave_monster(c,(context->origin).which.grid.x);
    _Var8 = square_isseen(cave,mon->grid);
    if (!_Var8) {
      return true;
    }
    add_monster_message(mon,L'2',true);
    return true;
  }
  fmt = "Failed to find teleport destination!";
LAB_0013e6f8:
  msg(fmt);
  return true;
}

Assistant:

bool effect_handler_TELEPORT(effect_handler_context_t *context)
{
	struct loc start = loc(context->x, context->y);
	int dis = context->value.base;
	int perc = context->value.m_bonus;
	int pick;
	struct loc grid;

	struct jumps {
		struct loc grid;
		struct jumps *next;
	} *spots = NULL;
	int num_spots = 0;
	int current_score = 2 * MAX(z_info->dungeon_wid, z_info->dungeon_hgt);
	bool only_vault_grids_possible = true;

	bool hostile = context->subtype ? true : false;
	bool is_player = (context->origin.what != SRC_MONSTER || hostile);
	struct monster *t_mon = monster_target_monster(context);

	context->ident = true;

	/* No teleporting in arena levels */
	if (player->upkeep->arena_level) return true;

	/* Establish the coordinates to teleport from, if we don't know already */
	if (!loc_is_zero(start)) {
		/* We're good */
	} else if (t_mon) {
		/* Monster targeting another monster */
		start = t_mon->grid;
	} else if (is_player) {
		/* Decoys get destroyed */
		struct loc decoy = cave_find_decoy(cave);
		if (!loc_is_zero(decoy) && hostile) {
			square_destroy_decoy(cave, decoy);
			return true;
		}

		start = player->grid;

		/* Check for a no teleport grid */
		if (square_isno_teleport(cave, start) &&
			((dis > 10) || (dis == 0))) {
			msg("Teleportation forbidden!");
			return true;
		}

		/* Check for a no teleport curse */
		if (player_of_has(player, OF_NO_TELEPORT)) {
			equip_learn_flag(player, OF_NO_TELEPORT);
			msg("Teleportation forbidden!");
			return true;
		}

		/* Check for teleport resistance */
		if (player_has(player, PF_PHASEWALK) && hostile) {
			msg("Teleport resistance!");
			return true;
		}
	} else {
		assert(context->origin.what == SRC_MONSTER);
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		start = mon->grid;
	}

	/* Percentage of the largest cardinal distance to an edge */
	if (perc) {
		int vertical = MAX(start.y, cave->height - start.y);
		int horizontal = MAX(start.x, cave->width - start.x);
		dis = (MAX(vertical, horizontal) * perc) / 100;
	}

	/* Randomise the distance a little */
	if (one_in_(2)) {
		dis -= randint0(dis / 4);
	} else {
		dis += randint0(dis / 4);
	}

	/* Make a list of the best grids, scoring by how good an approximation
	 * the distance from the start is to the distance we want */
	for (grid.y = 1; grid.y < cave->height - 1; grid.y++) {
		for (grid.x = 1; grid.x < cave->width - 1; grid.x++) {
			int d = distance(grid, start);
			int score = ABS(d - dis);
			struct jumps *new;

			/* Must move */
			if (d == 0) continue;

			if (!has_teleport_destination_prereqs(cave, grid,
					is_player)) continue;

			/* No teleporting into vaults and such, unless there's no choice */
			if (square_isvault(cave, grid)) {
				if (!only_vault_grids_possible) {
					continue;
				}
			} else {
				/* Just starting to consider non-vault grids, so reset score */
				if (only_vault_grids_possible) {
					current_score = 2 * MAX(z_info->dungeon_wid,
											z_info->dungeon_hgt);
				}
				only_vault_grids_possible = false;
			}

			/* Do we have better spots already? */
			if (score > current_score) continue;

			/* Make a new spot */
			new = mem_zalloc(sizeof(struct jumps));
			new->grid = grid;

			/* If improving start a new list, otherwise extend the old one */
			if (score < current_score) {
				current_score = score;
				while (spots) {
					struct jumps *next = spots->next;
					mem_free(spots);
					spots = next;
				}
				spots = new;
				num_spots = 1;
			} else {
				new->next = spots;
				spots = new;
				num_spots++;
			}
		}
	}

	/* Report failure (very unlikely) */
	if (!num_spots) {
		if (is_player) {
			msg("Failed to find teleport destination!");
		} else {
			/*
			 * With either teleport self or teleport other, it'll
			 * be the caster that is puzzled.
			 */
			struct monster *mon = cave_monster(cave,
				context->origin.which.monster);

			if (square_isseen(cave, mon->grid)) {
				add_monster_message(mon, MON_MSG_BRIEF_PUZZLE,
					true);
			}
		}
		return true;
	}

	/* Pick a spot */
	pick = randint0(num_spots);
	while (pick) {
		struct jumps *next = spots->next;
		mem_free(spots);
		spots = next;
		pick--;
	}

	/* Check for specialty speed boost on friendly teleports */
	if (is_player && !hostile && player_has(player, PF_PHASEWALK)) {
		player_add_speed_boost(player, 20 + distance(start, spots->grid));
	}

	/* Sound */
	sound(is_player ? MSG_TELEPORT : MSG_TPOTHER);

	/* Move player or monster */
	monster_swap(start, spots->grid);
	if (is_player) {
		player_handle_post_move(player, true,
			context->origin.what == SRC_MONSTER);
	}

	/* Clear any projection marker to prevent double processing */
	sqinfo_off(square(cave, spots->grid)->info, SQUARE_PROJECT);

	/* Clear monster target if it's no longer visible */
	if (!target_able(target_get_monster())) {
		target_set_monster(NULL);
	}

	/* Lots of updates after monster_swap */
	handle_stuff(player);

	while (spots) {
		struct jumps *next = spots->next;
		mem_free(spots);
		spots = next;
	}

	return true;
}